

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int64_t av1_highbd_block_error_c
                  (tran_low_t *coeff,tran_low_t *dqcoeff,intptr_t block_size,int64_t *ssz,int bd)

{
  int iVar1;
  byte bVar2;
  int64_t diff;
  int rounding;
  int shift;
  int64_t sqcoeff;
  int64_t error;
  int i;
  int bd_local;
  int64_t *ssz_local;
  intptr_t block_size_local;
  tran_low_t *dqcoeff_local;
  tran_low_t *coeff_local;
  
  error = 0;
  sqcoeff = 0;
  bVar2 = ((char)bd + -8) * '\x02';
  iVar1 = (1 << (bVar2 & 0x1f)) >> 1;
  for (i = 0; i < block_size; i = i + 1) {
    error = (long)(coeff[i] - dqcoeff[i]) * (long)(coeff[i] - dqcoeff[i]) + error;
    sqcoeff = (long)coeff[i] * (long)coeff[i] + sqcoeff;
  }
  *ssz = sqcoeff + iVar1 >> (bVar2 & 0x3f);
  return error + iVar1 >> (bVar2 & 0x3f);
}

Assistant:

int64_t av1_highbd_block_error_c(const tran_low_t *coeff,
                                 const tran_low_t *dqcoeff, intptr_t block_size,
                                 int64_t *ssz, int bd) {
  int i;
  int64_t error = 0, sqcoeff = 0;
  int shift = 2 * (bd - 8);
  int rounding = (1 << shift) >> 1;

  for (i = 0; i < block_size; i++) {
    const int64_t diff = coeff[i] - dqcoeff[i];
    error += diff * diff;
    sqcoeff += (int64_t)coeff[i] * (int64_t)coeff[i];
  }
  error = (error + rounding) >> shift;
  sqcoeff = (sqcoeff + rounding) >> shift;

  *ssz = sqcoeff;
  return error;
}